

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O1

Status __thiscall leveldb::VersionEdit::DecodeFrom(VersionEdit *this,Slice *src)

{
  VersionEdit *pVVar1;
  bool bVar2;
  undefined8 *in_RDX;
  _Alloc_hider _Var3;
  char *pcVar4;
  int level;
  uint32_t tag;
  uint32_t v;
  Status *result;
  InternalKey key;
  Slice str;
  uint64_t number;
  Slice input;
  FileMetaData f;
  uint local_190;
  uint32_t local_18c;
  undefined1 local_188 [8];
  _Alloc_hider local_180;
  char local_178 [8];
  char local_170 [24];
  char local_158 [16];
  _Alloc_hider local_148;
  char local_138 [16];
  Slice *local_128;
  vector<std::pair<int,leveldb::InternalKey>,std::allocator<std::pair<int,leveldb::InternalKey>>>
  *local_120;
  Slice *local_118;
  VersionEdit *local_110;
  size_t *local_108;
  Slice *local_100;
  size_t *local_f8;
  Slice *local_f0;
  _Alloc_hider local_e8;
  InternalKey local_e0;
  Slice local_c0;
  char *local_b0;
  Slice local_a8;
  FileMetaData local_98;
  Slice local_40;
  
  src->size_ = 0;
  *src->data_ = '\0';
  local_f0 = src + 2;
  local_118 = src + 6;
  *(undefined8 *)((long)&src[3].size_ + 5) = 0;
  src[3].data_ = (char *)0x0;
  src[3].size_ = 0;
  src[2].data_ = (char *)0x0;
  src[2].size_ = 0;
  local_110 = this;
  std::
  _Rb_tree<std::pair<int,_unsigned_long>,_std::pair<int,_unsigned_long>,_std::_Identity<std::pair<int,_unsigned_long>_>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
  ::clear((_Rb_tree<std::pair<int,_unsigned_long>,_std::pair<int,_unsigned_long>,_std::_Identity<std::pair<int,_unsigned_long>_>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
           *)local_118);
  local_128 = src + 9;
  std::
  vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
  ::_M_erase_at_end((vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                     *)local_128,(pointer)src[9].data_);
  local_a8.data_ = (char *)*in_RDX;
  local_a8.size_ = in_RDX[1];
  local_98.refs = 0;
  local_98.allowed_seeks = 0x40000000;
  local_98.file_size = 0;
  local_98.smallest.rep_._M_dataplus._M_p = (pointer)&local_98.smallest.rep_.field_2;
  local_98.smallest.rep_._M_string_length = 0;
  local_98.smallest.rep_.field_2._M_local_buf[0] = '\0';
  local_98.largest.rep_._M_dataplus._M_p = (pointer)&local_98.largest.rep_.field_2;
  local_98.largest.rep_._M_string_length = 0;
  local_98.largest.rep_.field_2._M_local_buf[0] = '\0';
  local_c0.data_ = "";
  local_c0.size_ = 0;
  local_e0.rep_._M_dataplus._M_p = (pointer)&local_e0.rep_.field_2;
  local_e0.rep_._M_string_length = 0;
  local_e0.rep_.field_2._M_local_buf[0] = '\0';
  local_120 = (vector<std::pair<int,leveldb::InternalKey>,std::allocator<std::pair<int,leveldb::InternalKey>>>
               *)&src[4].size_;
  local_f8 = &src[3].size_;
  local_100 = src + 3;
  local_108 = &src[2].size_;
  do {
    bVar2 = GetVarint32(&local_a8,&local_18c);
    if (!bVar2) {
      pcVar4 = "invalid tag";
      if (local_a8.size_ == 0) {
        pcVar4 = (char *)0x0;
      }
      break;
    }
    pcVar4 = "unknown tag";
    bVar2 = false;
    switch(local_18c) {
    case 1:
      bVar2 = GetLengthPrefixedSlice(&local_a8,&local_c0);
      if (bVar2) {
        local_188 = (undefined1  [8])local_178;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_188,local_c0.data_,local_c0.data_ + local_c0.size_);
        std::__cxx11::string::operator=((string *)src,(string *)local_188);
        if (local_188 != (undefined1  [8])local_178) {
          operator_delete((void *)local_188);
        }
        *(undefined1 *)&src[4].data_ = 1;
        bVar2 = true;
        pcVar4 = (char *)0x0;
      }
      else {
        bVar2 = false;
        pcVar4 = "comparator name";
      }
      break;
    case 2:
      bVar2 = GetVarint64(&local_a8,(uint64_t *)local_f0);
      if (bVar2) {
        *(undefined1 *)((long)&src[4].data_ + 1) = 1;
LAB_00130b31:
        bVar2 = true;
        pcVar4 = (char *)0x0;
      }
      else {
        bVar2 = false;
        pcVar4 = "log number";
      }
      break;
    case 3:
      bVar2 = GetVarint64(&local_a8,(uint64_t *)local_100);
      if (bVar2) {
        *(undefined1 *)((long)&src[4].data_ + 3) = 1;
        goto LAB_00130b31;
      }
      bVar2 = false;
      pcVar4 = "next file number";
      break;
    case 4:
      bVar2 = GetVarint64(&local_a8,local_f8);
      if (bVar2) {
        *(undefined1 *)((long)&src[4].data_ + 4) = 1;
        goto LAB_00130b31;
      }
      bVar2 = false;
      pcVar4 = "last sequence number";
      break;
    case 5:
      bVar2 = GetVarint32(&local_a8,(uint32_t *)local_188);
      if (bVar2 && (uint)local_188._0_4_ < 7) {
        local_190 = local_188._0_4_;
        bVar2 = GetInternalKey(&local_a8,&local_e0);
        if (bVar2) {
          local_188._0_4_ = local_190;
          local_180._M_p = local_170;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_180,local_e0.rep_._M_dataplus._M_p,
                     local_e0.rep_._M_dataplus._M_p + local_e0.rep_._M_string_length);
          std::
          vector<std::pair<int,leveldb::InternalKey>,std::allocator<std::pair<int,leveldb::InternalKey>>>
          ::emplace_back<std::pair<int,leveldb::InternalKey>>
                    (local_120,(pair<int,_leveldb::InternalKey> *)local_188);
          pcVar4 = local_170;
          _Var3._M_p = local_180._M_p;
LAB_00130b27:
          if (_Var3._M_p != pcVar4) {
            operator_delete(_Var3._M_p);
          }
          goto LAB_00130b31;
        }
      }
      bVar2 = false;
      pcVar4 = "compaction pointer";
      break;
    case 6:
      bVar2 = GetVarint32(&local_a8,(uint32_t *)local_188);
      if (bVar2 && (uint)local_188._0_4_ < 7) {
        local_190 = local_188._0_4_;
        bVar2 = GetVarint64(&local_a8,(uint64_t *)&local_b0);
        if (bVar2) {
          local_188._0_4_ = local_190;
          local_180._M_p = local_b0;
          std::
          _Rb_tree<std::pair<int,unsigned_long>,std::pair<int,unsigned_long>,std::_Identity<std::pair<int,unsigned_long>>,std::less<std::pair<int,unsigned_long>>,std::allocator<std::pair<int,unsigned_long>>>
          ::_M_insert_unique<std::pair<int,unsigned_long>>
                    ((_Rb_tree<std::pair<int,unsigned_long>,std::pair<int,unsigned_long>,std::_Identity<std::pair<int,unsigned_long>>,std::less<std::pair<int,unsigned_long>>,std::allocator<std::pair<int,unsigned_long>>>
                      *)local_118,(pair<int,_unsigned_long> *)local_188);
          goto LAB_00130b31;
        }
      }
      bVar2 = false;
      pcVar4 = "deleted file";
      break;
    case 7:
      bVar2 = GetVarint32(&local_a8,(uint32_t *)local_188);
      if (bVar2 && (uint)local_188._0_4_ < 7) {
        local_190 = local_188._0_4_;
        bVar2 = GetVarint64(&local_a8,&local_98.number);
        if ((((bVar2) && (bVar2 = GetVarint64(&local_a8,&local_98.file_size), bVar2)) &&
            (bVar2 = GetInternalKey(&local_a8,&local_98.smallest), bVar2)) &&
           (bVar2 = GetInternalKey(&local_a8,&local_98.largest), bVar2)) {
          std::pair<int,_leveldb::FileMetaData>::pair<int_&,_leveldb::FileMetaData_&,_true>
                    ((pair<int,_leveldb::FileMetaData> *)local_188,(int *)&local_190,&local_98);
          std::
          vector<std::pair<int,leveldb::FileMetaData>,std::allocator<std::pair<int,leveldb::FileMetaData>>>
          ::emplace_back<std::pair<int,leveldb::FileMetaData>>
                    ((vector<std::pair<int,leveldb::FileMetaData>,std::allocator<std::pair<int,leveldb::FileMetaData>>>
                      *)local_128,(pair<int,_leveldb::FileMetaData> *)local_188);
          if (local_148._M_p != local_138) {
            operator_delete(local_148._M_p);
          }
          pcVar4 = local_158;
          _Var3._M_p = (pointer)local_170._8_8_;
          goto LAB_00130b27;
        }
      }
      bVar2 = false;
      pcVar4 = "new-file entry";
      break;
    case 8:
      break;
    case 9:
      bVar2 = GetVarint64(&local_a8,local_108);
      if (bVar2) {
        *(undefined1 *)((long)&src[4].data_ + 2) = 1;
        goto LAB_00130b31;
      }
      bVar2 = false;
      pcVar4 = "previous log number";
      break;
    default:
      pcVar4 = "unknown tag";
      bVar2 = false;
    }
  } while (bVar2);
  pVVar1 = local_110;
  (local_110->comparator_)._M_dataplus._M_p = (pointer)0x0;
  if (pcVar4 != (char *)0x0) {
    local_188 = (undefined1  [8])0x1445cd;
    local_180._M_p = (char *)0xb;
    local_40.data_ = pcVar4;
    local_40.size_ = strlen(pcVar4);
    Status::Status((Status *)&local_e8,kCorruption,(Slice *)local_188,&local_40);
    (pVVar1->comparator_)._M_dataplus._M_p = local_e8._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.rep_._M_dataplus._M_p != &local_e0.rep_.field_2) {
    operator_delete(local_e0.rep_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.largest.rep_._M_dataplus._M_p != &local_98.largest.rep_.field_2) {
    operator_delete(local_98.largest.rep_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.smallest.rep_._M_dataplus._M_p != &local_98.smallest.rep_.field_2) {
    operator_delete(local_98.smallest.rep_._M_dataplus._M_p);
  }
  return (Status)(char *)pVVar1;
}

Assistant:

Status VersionEdit::DecodeFrom(const Slice& src) {
  Clear();
  Slice input = src;
  const char* msg = nullptr;
  uint32_t tag;

  // Temporary storage for parsing
  int level;
  uint64_t number;
  FileMetaData f;
  Slice str;
  InternalKey key;

  while (msg == nullptr && GetVarint32(&input, &tag)) {
    switch (tag) {
      case kComparator:
        if (GetLengthPrefixedSlice(&input, &str)) {
          comparator_ = str.ToString();
          has_comparator_ = true;
        } else {
          msg = "comparator name";
        }
        break;

      case kLogNumber:
        if (GetVarint64(&input, &log_number_)) {
          has_log_number_ = true;
        } else {
          msg = "log number";
        }
        break;

      case kPrevLogNumber:
        if (GetVarint64(&input, &prev_log_number_)) {
          has_prev_log_number_ = true;
        } else {
          msg = "previous log number";
        }
        break;

      case kNextFileNumber:
        if (GetVarint64(&input, &next_file_number_)) {
          has_next_file_number_ = true;
        } else {
          msg = "next file number";
        }
        break;

      case kLastSequence:
        if (GetVarint64(&input, &last_sequence_)) {
          has_last_sequence_ = true;
        } else {
          msg = "last sequence number";
        }
        break;

      case kCompactPointer:
        if (GetLevel(&input, &level) && GetInternalKey(&input, &key)) {
          compact_pointers_.push_back(std::make_pair(level, key));
        } else {
          msg = "compaction pointer";
        }
        break;

      case kDeletedFile:
        if (GetLevel(&input, &level) && GetVarint64(&input, &number)) {
          deleted_files_.insert(std::make_pair(level, number));
        } else {
          msg = "deleted file";
        }
        break;

      case kNewFile:
        if (GetLevel(&input, &level) && GetVarint64(&input, &f.number) &&
            GetVarint64(&input, &f.file_size) &&
            GetInternalKey(&input, &f.smallest) &&
            GetInternalKey(&input, &f.largest)) {
          new_files_.push_back(std::make_pair(level, f));
        } else {
          msg = "new-file entry";
        }
        break;

      default:
        msg = "unknown tag";
        break;
    }
  }

  if (msg == nullptr && !input.empty()) {
    msg = "invalid tag";
  }

  Status result;
  if (msg != nullptr) {
    result = Status::Corruption("VersionEdit", msg);
  }
  return result;
}